

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Performance::anon_unknown_0::RenderData::RenderData
          (RenderData *this,ObjectData *object,RenderContext *renderCtx,TestLog *log)

{
  pointer pfVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar3;
  long lVar4;
  undefined4 extraout_var_01;
  
  glu::ShaderProgram::ShaderProgram(&this->m_program,renderCtx,&object->shader);
  iVar2 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
            (&this->m_vao,(Functions *)CONCAT44(extraout_var,iVar2));
  iVar2 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&this->m_vbo,(Functions *)CONCAT44(extraout_var_00,iVar2));
  uVar3 = (ulong)((long)(object->geometry).super__Vector_base<float,_std::allocator<float>_>._M_impl
                        .super__Vector_impl_data._M_finish -
                 (long)(object->geometry).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  this->m_numVertices =
       (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) / 4);
  iVar2 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  lVar4 = CONCAT44(extraout_var_01,iVar2);
  if ((this->m_program).m_program.m_info.linkOk == false) {
    glu::operator<<(log,&this->m_program);
  }
  (**(code **)(lVar4 + 0x40))(0x8892,(this->m_vbo).super_ObjectWrapper.m_object);
  pfVar1 = (object->geometry).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  (**(code **)(lVar4 + 0x150))
            (0x8892,(long)(object->geometry).super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pfVar1,pfVar1,0x88e4);
  (**(code **)(lVar4 + 0x38))((this->m_program).m_program.m_program,0,"a_position");
  (**(code **)(lVar4 + 0xd8))((this->m_vao).super_ObjectWrapper.m_object);
  (**(code **)(lVar4 + 0x19f0))(0,4,0x1406,0,0,0);
  (**(code **)(lVar4 + 0x610))(0);
  (**(code **)(lVar4 + 0xd8))(0);
  return;
}

Assistant:

RenderData::RenderData (const ObjectData& object, const  glu::RenderContext& renderCtx, TestLog& log)
	: m_program		(renderCtx, object.shader)
	, m_vao			(renderCtx.getFunctions())
	, m_vbo			(renderCtx.getFunctions())
	, m_numVertices	(int(object.geometry.size())/4)
{
	const glw::Functions& gl = renderCtx.getFunctions();

	if (!m_program.isOk())
		log << m_program;

	gl.bindBuffer(GL_ARRAY_BUFFER, *m_vbo);
	gl.bufferData(GL_ARRAY_BUFFER, object.geometry.size() * sizeof(float), &object.geometry[0], GL_STATIC_DRAW);
	gl.bindAttribLocation(m_program.getProgram(), 0, "a_position");

	gl.bindVertexArray(*m_vao);
	gl.vertexAttribPointer(0, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
	gl.enableVertexAttribArray(0);
	gl.bindVertexArray(0);
}